

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * tinyxml2::XMLUtil::GetCharacterRef(char *p,char *value,int *length)

{
  undefined4 *in_RDX;
  long in_RDI;
  uint digitScaled_1;
  uint digit_1;
  char *q_1;
  uint digitScaled;
  uint digit;
  char *q;
  uint mult;
  ptrdiff_t delta;
  unsigned_long ucs;
  char *local_50;
  char *local_40;
  long local_30;
  char *local_8;
  
  *in_RDX = 0;
  if ((*(char *)(in_RDI + 1) == '#') && (*(char *)(in_RDI + 2) != '\0')) {
    if (*(char *)(in_RDI + 2) == 'x') {
      if (*(char *)(in_RDI + 3) == '\0') {
        local_8 = (char *)0x0;
      }
      else {
        local_40 = strchr((char *)(in_RDI + 3),0x3b);
        if (local_40 == (char *)0x0) {
          local_8 = (char *)0x0;
        }
        else {
          local_30 = (long)local_40 - in_RDI;
          do {
            local_40 = local_40 + -1;
            if (*local_40 == 'x') {
LAB_002a17a2:
              ConvertUTF32ToUTF8(_digitScaled,q_1,_digitScaled_1);
              return (char *)(in_RDI + local_30 + 1);
            }
          } while (((('/' < *local_40) && (*local_40 < ':')) ||
                   (('`' < *local_40 && (*local_40 < 'g')))) ||
                  (('@' < *local_40 && (*local_40 < 'G'))));
          local_8 = (char *)0x0;
        }
      }
    }
    else if (*(char *)(in_RDI + 2) == '\0') {
      local_8 = (char *)0x0;
    }
    else {
      local_50 = strchr((char *)(in_RDI + 2),0x3b);
      if (local_50 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        local_30 = (long)local_50 - in_RDI;
        do {
          local_50 = local_50 + -1;
          if (*local_50 == '#') goto LAB_002a17a2;
        } while (('/' < *local_50) && (*local_50 < ':'));
        local_8 = (char *)0x0;
      }
    }
  }
  else {
    local_8 = (char *)(in_RDI + 1);
  }
  return local_8;
}

Assistant:

const char* XMLUtil::GetCharacterRef( const char* p, char* value, int* length )
{
    // Presume an entity, and pull it out.
    *length = 0;

    if ( *(p+1) == '#' && *(p+2) ) {
        unsigned long ucs = 0;
        TIXMLASSERT( sizeof( ucs ) >= 4 );
        ptrdiff_t delta = 0;
        unsigned mult = 1;
        static const char SEMICOLON = ';';

        if ( *(p+2) == 'x' ) {
            // Hexadecimal.
            const char* q = p+3;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != 'x' ) {
                unsigned int digit = 0;

                if ( *q >= '0' && *q <= '9' ) {
                    digit = *q - '0';
                }
                else if ( *q >= 'a' && *q <= 'f' ) {
                    digit = *q - 'a' + 10;
                }
                else if ( *q >= 'A' && *q <= 'F' ) {
                    digit = *q - 'A' + 10;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( digit >= 0 && digit < 16);
                TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                const unsigned int digitScaled = mult * digit;
                TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                ucs += digitScaled;
                TIXMLASSERT( mult <= UINT_MAX / 16 );
                mult *= 16;
                --q;
            }
        }
        else {
            // Decimal.
            const char* q = p+2;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != '#' ) {
                if ( *q >= '0' && *q <= '9' ) {
                    const unsigned int digit = *q - '0';
                    TIXMLASSERT( digit >= 0 && digit < 10);
                    TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                    const unsigned int digitScaled = mult * digit;
                    TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                    ucs += digitScaled;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( mult <= UINT_MAX / 10 );
                mult *= 10;
                --q;
            }
        }
        // convert the UCS to UTF-8
        ConvertUTF32ToUTF8( ucs, value, length );
        return p + delta + 1;
    }
    return p+1;
}